

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply_test.cc
# Opt level: O2

void intgemm::TestSelectColumnsB<intgemm::AVX2::Kernels8>(Index rows,Index cols)

{
  float *pfVar1;
  result_type_conflict1 rVar2;
  int iVar3;
  long lVar4;
  Index IVar5;
  int c;
  long lVar6;
  ulong size;
  result_type_conflict rVar7;
  AlignedVector<signed_char> ref;
  AlignedVector<signed_char> test;
  AlignedVector<float> input;
  AlignedVector<float> selected;
  AlignedVector<signed_char> prepared;
  BinaryExpr<const_int_&,_const_int_&> local_1558;
  string local_1528;
  AssertionHandler catchAssertionHandler;
  SourceLineInfo local_14a8;
  StringRef local_1498;
  param_type local_1488;
  uniform_int_distribution<unsigned_int> col_dist;
  StringRef local_1478;
  Index select_cols [24];
  ScopedMessage scopedMessage17;
  mt19937 gen;
  
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&gen);
  local_1488._M_a = -129.0;
  local_1488._M_b = 129.0;
  AlignedVector<float>::AlignedVector(&input,(ulong)(cols * rows),0x40);
  pfVar1 = input.mem_;
  lVar6 = input.size_ << 2;
  for (lVar4 = 0; lVar6 != lVar4; lVar4 = lVar4 + 4) {
    rVar7 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)&local_1488,&gen);
    *(result_type_conflict *)((long)pfVar1 + lVar4) = rVar7;
  }
  AlignedVector<signed_char>::AlignedVector(&prepared,input.size_,0x40);
  AVX2::Kernels8::PrepareB(input.mem_,prepared.mem_,1.0,rows,cols);
  col_dist._M_param._M_b = cols - 1;
  col_dist._M_param._M_a = 0;
  for (lVar4 = 0; lVar4 != 0x60; lVar4 = lVar4 + 4) {
    rVar2 = std::uniform_int_distribution<unsigned_int>::operator()(&col_dist,&gen);
    *(result_type_conflict1 *)((long)select_cols + lVar4) = rVar2;
  }
  size = (ulong)(rows * 0x18);
  AlignedVector<signed_char>::AlignedVector(&test,size,0x40);
  AVX2::Kernels8::SelectColumnsB(prepared.mem_,test.mem_,rows,select_cols,(Index *)&scopedMessage17)
  ;
  AlignedVector<float>::AlignedVector(&selected,size,0x40);
  iVar3 = 0;
  for (IVar5 = 0; IVar5 != rows; IVar5 = IVar5 + 1) {
    for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 1) {
      selected.mem_[(uint)(iVar3 + (int)lVar4)] = input.mem_[select_cols[lVar4] + IVar5 * cols];
    }
    iVar3 = iVar3 + 0x18;
  }
  AlignedVector<signed_char>::AlignedVector(&ref,size,0x40);
  AVX2::Kernels8::PrepareB(selected.mem_,ref.mem_,1.0,rows,0x18);
  local_1498.m_start = anon_var_dwarf_18a79d + 9;
  local_1498.m_size = 4;
  local_14a8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/multiply_test.cc";
  local_14a8.line = 0x9b;
  Catch::MessageBuilder::MessageBuilder
            ((MessageBuilder *)&catchAssertionHandler,&local_1498,&local_14a8,Info);
  std::operator<<((ostream *)catchAssertionHandler.m_assertionInfo.lineInfo.file,"Reference:\n");
  PrintMatrix<signed_char>((string *)&local_1558,ref.mem_,rows,0x18);
  std::operator<<((ostream *)catchAssertionHandler.m_assertionInfo.lineInfo.file,
                  (string *)&local_1558);
  PrintMatrix<signed_char>(&local_1528,test.mem_,rows,0x18);
  std::operator<<((ostream *)catchAssertionHandler.m_assertionInfo.lineInfo.file,
                  (string *)&local_1528);
  Catch::ScopedMessage::ScopedMessage(&scopedMessage17,(MessageBuilder *)&catchAssertionHandler);
  std::__cxx11::string::~string((string *)&local_1528);
  std::__cxx11::string::~string((string *)&local_1558);
  Catch::MessageBuilder::~MessageBuilder((MessageBuilder *)&catchAssertionHandler);
  local_1558.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x18fab9;
  local_1558.super_ITransientExpression.m_isBinaryExpression = true;
  local_1558.super_ITransientExpression.m_result = false;
  local_1558.super_ITransientExpression._10_6_ = 0;
  local_1528._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/multiply_test.cc";
  local_1528._M_string_length = 0x9b;
  Catch::StringRef::StringRef
            (&local_1478,
             "memcmp(ref.begin(), test.begin(), sizeof(Integer) * rows * kSelectCols) == 0");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_1558,(SourceLineInfo *)&local_1528,
             local_1478,ContinueOnFailure);
  iVar3 = memcmp(ref.mem_,test.mem_,(ulong)rows * 0x18);
  local_1498.m_start = (char *)CONCAT44(local_1498.m_start._4_4_,iVar3);
  local_14a8.file = (char *)((ulong)local_14a8.file & 0xffffffff00000000);
  local_1528._M_dataplus._M_p = (pointer)&local_1498;
  Catch::ExprLhs<int_const&>::operator==
            (&local_1558,(ExprLhs<int_const&> *)&local_1528,(int *)&local_14a8);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_1558.super_ITransientExpression)
  ;
  Catch::ITransientExpression::~ITransientExpression(&local_1558.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  Catch::ScopedMessage::~ScopedMessage(&scopedMessage17);
  free(ref.mem_);
  free(selected.mem_);
  free(test.mem_);
  free(prepared.mem_);
  free(input.mem_);
  return;
}

Assistant:

void TestSelectColumnsB(Index rows = 64, Index cols = 16) {
  std::mt19937 gen;
  // Go somewhat out of range too.
  std::uniform_real_distribution<float> dist(-129.0, 129.0);
  AlignedVector<float> input(rows * cols);
  for (auto& it : input) {
    it = dist(gen);
  }
  using Integer = typename Routine::Integer;
  AlignedVector<Integer> prepared(input.size());
  Routine::PrepareB(input.begin(), prepared.begin(), 1, rows, cols);

  const int kSelectCols = 24;
  Index select_cols[kSelectCols];
  std::uniform_int_distribution<Index> col_dist(0, cols - 1);
  for (auto& it : select_cols) {
    it = col_dist(gen);
  }

  AlignedVector<Integer> test(rows * kSelectCols);
  Routine::SelectColumnsB(prepared.begin(), test.begin(), rows, select_cols, select_cols + kSelectCols);

  // Select columns manually in float space.
  AlignedVector<float> selected(rows * kSelectCols);
  for (Index r = 0; r < rows; ++r) {
    for (int c = 0; c < kSelectCols; ++c) {
      assert(c + r * kSelectCols < rows * kSelectCols);
      selected[c + r * kSelectCols] = input[select_cols[c] + r * cols];
    }
  }
  AlignedVector<Integer> ref(rows * kSelectCols);
  Routine::PrepareB(selected.begin(), ref.begin(), 1, rows, kSelectCols);
  CHECK_MESSAGE(memcmp(ref.begin(), test.begin(), sizeof(Integer) * rows * kSelectCols) == 0, "Reference:\n" <<
  	PrintMatrix(ref.begin(), rows, kSelectCols) << PrintMatrix(test.begin(), rows, kSelectCols));
}